

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar_check.cpp
# Opt level: O0

void __thiscall CalendarFixture::CalendarFixture(CalendarFixture *this)

{
  GregorianCalendar *this_00;
  CalendarFixture *this_local;
  
  (this->super_TestWithParam<int>).super_Test._vptr_Test = (_func_int **)0x0;
  (this->super_TestWithParam<int>).super_Test.gtest_flag_saver_._M_t.
  super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
  .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl =
       (GTestFlagSaver *)0x0;
  (this->super_TestWithParam<int>).super_WithParamInterface<int>._vptr_WithParamInterface =
       (_func_int **)0x0;
  testing::TestWithParam<int>::TestWithParam(&this->super_TestWithParam<int>);
  (this->super_TestWithParam<int>).super_Test._vptr_Test =
       (_func_int **)&PTR__CalendarFixture_001f6520;
  (this->super_TestWithParam<int>).super_WithParamInterface<int>._vptr_WithParamInterface =
       (_func_int **)&PTR__CalendarFixture_001f6560;
  this_00 = (GregorianCalendar *)operator_new(0x18);
  GregorianCalendar::GregorianCalendar(this_00,4,0xe,0x7df);
  this->gregorian_calendar = this_00;
  return;
}

Assistant:

CalendarFixture() : TestWithParam<int>() {
        gregorian_calendar = new GregorianCalendar(TEST_MONTH_GR, TEST_DAY_GR, TEST_YEAR_GR);
    }